

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void opj_t1_destroy(opj_t1_t *p_t1)

{
  if (p_t1 != (opj_t1_t *)0x0) {
    if ((p_t1->encoder == 0) && (p_t1->data != (OPJ_INT32 *)0x0)) {
      opj_aligned_free(p_t1->data);
      p_t1->data = (OPJ_INT32 *)0x0;
    }
    if (p_t1->flags != (opj_flag_t *)0x0) {
      opj_aligned_free(p_t1->flags);
      p_t1->flags = (opj_flag_t *)0x0;
    }
    opj_free(p_t1->cblkdatabuffer);
    opj_free(p_t1);
    return;
  }
  return;
}

Assistant:

void opj_t1_destroy(opj_t1_t *p_t1)
{
    if (! p_t1) {
        return;
    }

    /* encoder uses tile buffer, so no need to free */
    if (!p_t1->encoder && p_t1->data) {
        opj_aligned_free(p_t1->data);
        p_t1->data = 00;
    }

    if (p_t1->flags) {
        opj_aligned_free(p_t1->flags);
        p_t1->flags = 00;
    }

    opj_free(p_t1->cblkdatabuffer);

    opj_free(p_t1);
}